

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asynclog.cpp
# Opt level: O1

void __thiscall AsyncLog::AsyncLog(AsyncLog *this)

{
  Mutex *this_00;
  Condition *pCVar1;
  FixedBuffer<4096UL> *pFVar2;
  LogFile *this_01;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  this->m_bRunning = false;
  this_00 = (Mutex *)operator_new(0x28);
  Mutex::Mutex(this_00);
  (this->m_mutex)._M_t.super___uniq_ptr_impl<Mutex,_std::default_delete<Mutex>_>._M_t.
  super__Tuple_impl<0UL,_Mutex_*,_std::default_delete<Mutex>_>.super__Head_base<0UL,_Mutex_*,_false>
  ._M_head_impl = this_00;
  pCVar1 = (Condition *)operator_new(0x38);
  Condition::Condition(pCVar1,this_00);
  (this->m_mainThreadRunCond)._M_t.super___uniq_ptr_impl<Condition,_std::default_delete<Condition>_>
  ._M_t.super__Tuple_impl<0UL,_Condition_*,_std::default_delete<Condition>_>.
  super__Head_base<0UL,_Condition_*,_false>._M_head_impl = pCVar1;
  pCVar1 = (Condition *)operator_new(0x38);
  Condition::Condition
            (pCVar1,(this->m_mutex)._M_t.super___uniq_ptr_impl<Mutex,_std::default_delete<Mutex>_>.
                    _M_t.super__Tuple_impl<0UL,_Mutex_*,_std::default_delete<Mutex>_>.
                    super__Head_base<0UL,_Mutex_*,_false>._M_head_impl);
  (this->m_subThreadFlushCond)._M_t.
  super___uniq_ptr_impl<Condition,_std::default_delete<Condition>_>._M_t.
  super__Tuple_impl<0UL,_Condition_*,_std::default_delete<Condition>_>.
  super__Head_base<0UL,_Condition_*,_false>._M_head_impl = pCVar1;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x18);
  *(code **)local_58._M_unused._0_8_ = ThreadFunc;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(AsyncLog **)((long)local_58._M_unused._0_8_ + 0x10) = this;
  pcStack_40 = std::_Function_handler<void_(),_std::_Bind<void_(AsyncLog::*(AsyncLog_*))()>_>::
               _M_invoke;
  local_48 = std::_Function_handler<void_(),_std::_Bind<void_(AsyncLog::*(AsyncLog_*))()>_>::
             _M_manager;
  Thread::Thread(&this->m_thread,(CallFunc *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  pFVar2 = (FixedBuffer<4096UL> *)operator_new(0x1008);
  pFVar2->m_pos = 0;
  (this->m_curBuff)._M_t.
  super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>._M_t.
  super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>.
  super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl = pFVar2;
  pFVar2 = (FixedBuffer<4096UL> *)operator_new(0x1008);
  pFVar2->m_pos = 0;
  (this->m_nextBuff)._M_t.
  super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>._M_t.
  super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>.
  super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl = pFVar2;
  (this->m_buffers).
  super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_buffers).
  super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_buffers).
  super__Vector_base<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_01 = (LogFile *)operator_new(0x28);
  LogFile::LogFile(this_01);
  (this->m_logFilePtr)._M_t.super___uniq_ptr_impl<LogFile,_std::default_delete<LogFile>_>._M_t.
  super__Tuple_impl<0UL,_LogFile_*,_std::default_delete<LogFile>_>.
  super__Head_base<0UL,_LogFile_*,_false>._M_head_impl = this_01;
  std::
  vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
  ::reserve(&this->m_buffers,8);
  return;
}

Assistant:

AsyncLog::AsyncLog()
	: m_bRunning(false),
	m_mutex (new Mutex), 
	m_mainThreadRunCond(new Condition(*m_mutex)),
	m_subThreadFlushCond(new Condition(*m_mutex)), 
	m_thread(std::bind(&AsyncLog::ThreadFunc, this)), 
	m_curBuff(new Buffer), 
	m_nextBuff(new Buffer),
	m_logFilePtr(new LogFile)
{
	m_buffers.reserve(8);
}